

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void testPhiVsSampled(LightHandle *light,SampledWavelengths *lambda)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM5 [16];
  SampledSpectrum SVar12;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Float invBase_1;
  Float invBase;
  optional<pbrt::LightLeSample> ls;
  AssertHelper local_138;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  AssertHelper local_128;
  string local_120;
  LightHandle *local_100;
  SampledWavelengths *local_f8;
  double local_f0;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  AssertHelper local_d8;
  undefined1 local_d0 [144];
  float local_40 [2];
  bool local_38;
  
  local_dc = 0.5;
  local_e0 = 0.33333334;
  local_e4 = 0.2;
  local_e8 = 0.14285715;
  local_f0 = 0.0;
  uVar2 = 0;
  local_100 = light;
  local_f8 = lambda;
  do {
    auVar6 = ZEXT816(0) << 0x40;
    if (uVar2 != 0) {
      fVar7 = 1.0;
      lVar3 = 0;
      uVar1 = uVar2;
      do {
        lVar3 = (lVar3 - uVar1 / 2) * 2 + uVar1;
        fVar7 = local_dc * fVar7;
        bVar5 = 1 < uVar1;
        uVar1 = uVar1 / 2;
      } while (bVar5);
      auVar6 = vcvtusi2ss_avx512f(in_XMM5,lVar3);
      auVar6 = ZEXT416((uint)(fVar7 * auVar6._0_4_));
    }
    auVar8 = ZEXT816(0) << 0x40;
    auVar9 = ZEXT816(0) << 0x40;
    if (uVar2 != 0) {
      fVar7 = 1.0;
      lVar3 = 0;
      uVar1 = uVar2;
      do {
        lVar3 = (lVar3 - uVar1 / 3) * 3 + uVar1;
        fVar7 = local_e0 * fVar7;
        bVar5 = 2 < uVar1;
        uVar1 = uVar1 / 3;
      } while (bVar5);
      auVar9 = vcvtusi2ss_avx512f(in_XMM5,lVar3);
      auVar9 = ZEXT416((uint)(fVar7 * auVar9._0_4_));
    }
    if (uVar2 != 0) {
      fVar7 = 1.0;
      lVar3 = 0;
      uVar1 = uVar2;
      do {
        lVar3 = (lVar3 - uVar1 / 5) * 5 + uVar1;
        fVar7 = local_e4 * fVar7;
        bVar5 = 4 < uVar1;
        uVar1 = uVar1 / 5;
      } while (bVar5);
      auVar8 = vcvtusi2ss_avx512f(in_XMM5,lVar3);
      auVar8 = ZEXT416((uint)(fVar7 * auVar8._0_4_));
    }
    if (uVar2 == 0) {
      auVar10 = ZEXT816(0) << 0x40;
    }
    else {
      fVar7 = 1.0;
      lVar3 = 0;
      uVar1 = uVar2;
      do {
        lVar3 = (lVar3 - uVar1 / 7) * 7 + uVar1;
        fVar7 = local_e8 * fVar7;
        bVar5 = 6 < uVar1;
        uVar1 = uVar1 / 7;
      } while (bVar5);
      auVar10 = vcvtusi2ss_avx512f(in_XMM5,lVar3);
      auVar10 = ZEXT416((uint)(fVar7 * auVar10._0_4_));
    }
    auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
    auVar6 = vminss_avx(auVar11,auVar6);
    auVar9 = vminss_avx(auVar11,auVar9);
    auVar6 = vinsertps_avx(auVar6,auVar9,0x10);
    auVar8 = vminss_avx(auVar11,auVar8);
    auVar9 = vminss_avx(auVar11,auVar10);
    auVar8 = vinsertps_avx(auVar8,auVar9,0x10);
    pbrt::LightHandle::SampleLe
              ((optional<pbrt::LightLeSample> *)local_d0,local_100,(Point2f)auVar6._0_8_,
               (Point2f)auVar8._0_8_,local_f8,0.0);
    if (local_38 != false) {
      if ((((float)local_d0._16_4_ != 0.0) || ((float)local_d0._20_4_ != 0.0)) ||
         (NAN((float)local_d0._20_4_))) {
        local_138.data_ = (AssertHelperData *)((ulong)local_138.data_._1_7_ << 8);
LAB_00254c39:
        local_130.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_120,(internal *)&local_138,
                   (AssertionResult *)"ls->ray.o == Point3f(0, 0, 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x77,local_120._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_128.data_ != (AssertHelperData *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && (local_128.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_128.data_ + 8))();
          }
          local_128.data_ = (AssertHelperData *)0x0;
        }
      }
      else {
        local_138.data_._0_1_ = (float)local_d0._24_4_ == 0.0;
        local_130.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (((float)local_d0._24_4_ != 0.0) || (NAN((float)local_d0._24_4_))) goto LAB_00254c39;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_138.data_._0_4_ = 1;
      if (local_38 == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
      }
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&local_120,"1","ls->pdfPos",(int *)&local_138,local_40);
      if ((char)local_120._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        pcVar4 = "";
        if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
          pcVar4 = *(char **)local_120._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x78,pcVar4);
        testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        if (local_138.data_ != (AssertHelperData *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && (local_138.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_138.data_ + 8))();
          }
          local_138.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_38 == false) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
      }
      local_f0 = local_f0 + (double)((float)local_d0._0_4_ / local_40[1]);
    }
    if (local_38 == true) {
      if (local_d0[0x88] == '\x01') {
        local_d0[0x88] = '\0';
      }
      local_38 = false;
    }
    uVar2 = uVar2 + 1;
    if (uVar2 == 100000) {
      SVar12 = pbrt::LightHandle::Phi(local_100,local_f8);
      local_100 = (LightHandle *)(local_f0 / 100000.0);
      local_f8 = (SampledWavelengths *)(double)SVar12.values.values[0];
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (double)local_100 - (double)local_f8;
      auVar6 = vandpd_avx512vl(auVar8,auVar6);
      local_120._M_dataplus._M_p = (pointer)(auVar6._0_8_ / (double)local_f8);
      local_138.data_ = (AssertHelperData *)&DAT_3f847ae147ae147b;
      testing::internal::CmpHelperLT<double,double>
                ((internal *)local_d0,"std::abs(sum / count - Phi[0]) / Phi[0]","1e-2",
                 (double *)&local_120,(double *)&local_138);
      if (local_d0[0] == '\0') {
        testing::Message::Message((Message *)&local_120);
        std::ostream::_M_insert<double>((double)local_f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_120._M_dataplus._M_p + 0x10),", sampled ",10);
        std::ostream::_M_insert<double>((double)local_100);
        if ((undefined8 *)local_d0._8_8_ == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_d0._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x7c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && ((long *)local_120._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
          }
          local_120._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d0 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

static void testPhiVsSampled(LightHandle light, SampledWavelengths &lambda) {
    double sum = 0;
    int count = 100000;
    for (int i = 0; i < count; ++i) {
        Point2f u1{RadicalInverse(0, i), RadicalInverse(1, i)};
        Point2f u2{RadicalInverse(2, i), RadicalInverse(3, i)};
        pstd::optional<LightLeSample> ls = light.SampleLe(u1, u2, lambda, 0 /* time */);
        if (!ls)
            continue;

        EXPECT_TRUE(ls->ray.o == Point3f(0, 0, 0));
        EXPECT_EQ(1, ls->pdfPos);
        sum += ls->L[0] / ls->pdfDir;
    }
    SampledSpectrum Phi = light.Phi(lambda);
    EXPECT_LT(std::abs(sum / count - Phi[0]) / Phi[0], 1e-2)
        << Phi[0] << ", sampled " << sum / count;
}